

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O1

bool __thiscall fast_float::bigint::pow5(bigint *this,uint32_t exp)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  size_t in_RCX;
  limb lVar8;
  ushort uVar9;
  ulong uVar10;
  ulong uVar11;
  limb_span y;
  
  if (0x86 < exp) {
    do {
      y.length = in_RCX;
      y.ptr = (unsigned_long *)0x5;
      bVar7 = large_mul<(unsigned_short)62>
                        ((fast_float *)this,
                         (stackvec<(unsigned_short)62> *)pow5_tables<void>::large_power_of_5,y);
      if (!bVar7) goto LAB_003dcaf6;
      exp = exp - 0x87;
    } while (0x86 < exp);
  }
  if (0x1a < exp) {
    uVar9 = (this->vec).length;
    do {
      if (uVar9 == 0) {
        lVar8 = 0;
      }
      else {
        uVar10 = 0;
        lVar8 = 0;
        do {
          auVar5._8_8_ = 0;
          auVar5._0_8_ = lVar8;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = (this->vec).data[uVar10];
          auVar5 = ZEXT816(0x6765c793fa10079d) * auVar3 + auVar5;
          lVar8 = auVar5._8_8_;
          (this->vec).data[uVar10] = auVar5._0_8_;
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
      }
      if (lVar8 != 0) {
        if (0x3d < uVar9) goto LAB_003dcaf6;
        (this->vec).data[uVar9] = lVar8;
        uVar9 = uVar9 + 1;
        (this->vec).length = uVar9;
      }
      exp = exp - 0x1b;
    } while (0x1a < exp);
  }
  bVar7 = true;
  if (exp != 0) {
    uVar9 = (this->vec).length;
    uVar10 = (ulong)uVar9;
    if (uVar10 == 0) {
      lVar8 = 0;
    }
    else {
      uVar1 = *(ulong *)(pow5_tables<void>::small_power_of_5 + (ulong)exp * 8);
      uVar11 = 0;
      lVar8 = 0;
      do {
        auVar6._8_8_ = 0;
        auVar6._0_8_ = lVar8;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar1;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = (this->vec).data[uVar11];
        auVar6 = auVar2 * auVar4 + auVar6;
        lVar8 = auVar6._8_8_;
        (this->vec).data[uVar11] = auVar6._0_8_;
        uVar11 = uVar11 + 1;
      } while (uVar10 != uVar11);
    }
    if (lVar8 != 0) {
      if (uVar9 < 0x3e) {
        (this->vec).data[uVar10] = lVar8;
        (this->vec).length = uVar9 + 1;
      }
      else {
LAB_003dcaf6:
        bVar7 = false;
      }
    }
  }
  return bVar7;
}

Assistant:

FASTFLOAT_CONSTEXPR20 bool pow5(uint32_t exp) noexcept {
    // multiply by a power of 5
    size_t large_length = sizeof(large_power_of_5) / sizeof(limb);
    limb_span large = limb_span(large_power_of_5, large_length);
    while (exp >= large_step) {
      FASTFLOAT_TRY(large_mul(vec, large));
      exp -= large_step;
    }
#ifdef FASTFLOAT_64BIT_LIMB
    uint32_t small_step = 27;
    limb max_native = 7450580596923828125UL;
#else
    uint32_t small_step = 13;
    limb max_native = 1220703125U;
#endif
    while (exp >= small_step) {
      FASTFLOAT_TRY(small_mul(vec, max_native));
      exp -= small_step;
    }
    if (exp != 0) {
      // Work around clang bug https://godbolt.org/z/zedh7rrhc
      // This is similar to https://github.com/llvm/llvm-project/issues/47746,
      // except the workaround described there don't work here
      FASTFLOAT_TRY(
        small_mul(vec, limb(((void)small_power_of_5[0], small_power_of_5[exp])))
      );
    }

    return true;
  }